

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall jsonnet::internal::Allocator::~Allocator(Allocator *this)

{
  ASTs *this_00;
  undefined8 *puVar1;
  _List_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  *__range2;
  _List_node_base *p_Var4;
  
  this_00 = &this->allocated;
  for (p_Var4 = (this->allocated).
                super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)this_00
      ; p_Var4 = p_Var4->_M_next) {
    if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 8))();
    }
  }
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::clear
            (this_00);
  for (p_Var3 = (this->internedIdentifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->internedIdentifiers)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    puVar1 = *(undefined8 **)(p_Var3 + 2);
    if (puVar1 != (undefined8 *)0x0) {
      if ((long *)*puVar1 != puVar1 + 2) {
        operator_delete((long *)*puVar1,puVar1[2] * 4 + 4);
      }
      operator_delete(puVar1,0x20);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
           *)this);
  p_Var4 = (this->allocated).
           super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)this_00) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
               *)this);
  return;
}

Assistant:

~Allocator()
    {
        for (auto x : allocated) {
            delete x;
        }
        allocated.clear();
        for (const auto &x : internedIdentifiers) {
            delete x.second;
        }
        internedIdentifiers.clear();
    }